

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O0

void __thiscall muduo::ThreadPool::runInThread(ThreadPool *this)

{
  bool bVar1;
  long in_RDI;
  Exception *ex;
  exception *ex_1;
  Task task;
  function<void_()> *in_stack_ffffffffffffff80;
  ThreadPool *in_stack_ffffffffffffffa8;
  
  bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff80);
  if (bVar1) {
    std::function<void_()>::operator()(in_stack_ffffffffffffff80);
  }
  while ((*(byte *)(in_RDI + 0x158) & 1) != 0) {
    take(in_stack_ffffffffffffffa8);
    bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff80);
    if (bVar1) {
      std::function<void_()>::operator()(in_stack_ffffffffffffff80);
    }
    std::function<void_()>::~function((function<void_()> *)0x151488);
  }
  return;
}

Assistant:

void ThreadPool::runInThread()
{
  try
  {
    if (threadInitCallback_)
    {
      threadInitCallback_();
    }
    while (running_)
    {
      Task task(take());
      if (task)
      {
        task();
      }
    }
  }
  catch (const Exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    fprintf(stderr, "stack trace: %s\n", ex.stackTrace());
    abort();
  }
  catch (const std::exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    abort();
  }
  catch (...)
  {
    fprintf(stderr, "unknown exception caught in ThreadPool %s\n", name_.c_str());
    throw; // rethrow
  }
}